

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void CompoundFile::readData<short>(istream *stream,short *data,size_t bytes)

{
  ulong in_RDX;
  ushort *in_RSI;
  char *in_RDI;
  char c;
  size_t i;
  undefined8 local_20;
  undefined8 local_18;
  
  *in_RSI = 0;
  local_18 = in_RDX;
  if (in_RDX == 0) {
    local_18 = 2;
  }
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    std::istream::get(in_RDI);
    *in_RSI = *in_RSI | (ushort)(0 << ((byte)((local_20 & 0x1fffffff) << 3) & 0x1f));
  }
  return;
}

Assistant:

void readData( std::istream & stream, Type & data, size_t bytes = 0 )
{
	data = Type(0);
	if( bytes == 0 ) bytes = sizeof( Type );

	for( size_t i = 0; i < bytes; ++i )
	{
		char c = 0x00;
		stream.get( c );

		data |= (((Type) (unsigned char) c ) << 8*i);
	}
}